

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_pvrtc1_4.cpp
# Opt level: O3

bool __thiscall
basisu::pvrtc4_image::get_interpolated_colors
          (pvrtc4_image *this,uint32_t x,uint32_t y,color_rgba *pColors)

{
  uint32_t uVar1;
  int iVar2;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar3;
  uint32_t c_1;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint32_t c;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int u_interp;
  int v_interp;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  short sVar22;
  undefined1 auVar17 [15];
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar16;
  short sVar15;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  undefined1 auVar18 [16];
  short sVar28;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar29 [16];
  color_rgba result;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_5c;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_58;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_54;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_50;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_4c;
  ulong local_48;
  ulong local_40;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_38;
  
  if ((this->m_width <= x) || (this->m_height <= y)) {
    __assert_fail("(x < m_width) && (y < m_height)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.cpp"
                  ,0x12e,
                  "bool basisu::pvrtc4_image::get_interpolated_colors(uint32_t, uint32_t, color_rgba *) const"
                 );
  }
  uVar12 = (ulong)x;
  uVar11 = (int)(x - 2) >> 2;
  uVar9 = uVar11 + 1;
  uVar6 = (int)(y - 2) >> 2;
  uVar1 = this->m_block_width;
  if ((int)uVar11 < 0) {
    uVar5 = (int)uVar11 % (int)uVar1 + uVar1;
    if ((int)uVar11 % (int)uVar1 == 0) {
      uVar5 = 0;
    }
    bVar14 = uVar11 == 0xffffffff;
    uVar11 = uVar5;
    if (bVar14) goto LAB_00249fdd;
    iVar8 = (int)uVar9 % (int)uVar1;
    uVar9 = uVar1 + iVar8;
    if (iVar8 == 0) {
      uVar9 = 0;
    }
  }
  else {
    if ((int)uVar1 <= (int)uVar11) {
      uVar11 = (int)uVar11 % (int)uVar1;
    }
LAB_00249fdd:
    uVar5 = uVar11;
    if ((int)uVar1 <= (int)uVar9) {
      uVar9 = (int)uVar9 % (int)uVar1;
    }
  }
  uVar11 = uVar6 + 1;
  uVar1 = this->m_block_height;
  if ((int)uVar6 < 0) {
    uVar13 = (int)uVar6 % (int)uVar1 + uVar1;
    if ((int)uVar6 % (int)uVar1 == 0) {
      uVar13 = 0;
    }
    bVar14 = uVar6 == 0xffffffff;
    uVar6 = uVar13;
    if (bVar14) goto LAB_0024a028;
    iVar8 = (int)uVar11 % (int)uVar1;
    uVar11 = uVar1 + iVar8;
    if (iVar8 == 0) {
      uVar11 = 0;
    }
  }
  else {
    if ((int)uVar1 <= (int)uVar6) {
      uVar6 = (int)uVar6 % (int)uVar1;
    }
LAB_0024a028:
    uVar13 = uVar6;
    if ((int)uVar1 <= (int)uVar11) {
      uVar11 = (int)uVar11 % (int)uVar1;
    }
  }
  uVar6 = (this->m_blocks).m_width;
  if ((uVar5 < uVar6) && (uVar13 < (this->m_blocks).m_height)) {
    uVar6 = uVar6 * uVar13 + uVar5;
    local_48 = (ulong)y;
    if (uVar6 < (this->m_blocks).m_values.m_size) {
      local_50.field_1 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
           pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,0);
      uVar6 = (this->m_blocks).m_width;
      if ((uVar6 <= uVar9) || ((this->m_blocks).m_height <= uVar13)) goto LAB_0024a44d;
      uVar6 = uVar6 * uVar13 + uVar9;
      if (uVar6 < (this->m_blocks).m_values.m_size) {
        local_54.field_1 =
             (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
             pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,0);
        uVar6 = (this->m_blocks).m_width;
        if ((uVar6 <= uVar5) || ((this->m_blocks).m_height <= uVar11)) goto LAB_0024a44d;
        uVar6 = uVar6 * uVar11 + uVar5;
        if (uVar6 < (this->m_blocks).m_values.m_size) {
          local_58.field_1 =
               (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
               pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,0);
          uVar6 = (this->m_blocks).m_width;
          if ((uVar6 <= uVar9) || ((this->m_blocks).m_height <= uVar11)) goto LAB_0024a44d;
          uVar6 = uVar6 * uVar11 + uVar9;
          local_38 = &pColors->field_0;
          if (uVar6 < (this->m_blocks).m_values.m_size) {
            lVar10 = 0;
            local_5c.field_1 =
                 (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                 pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,0);
            paVar3 = local_38;
            iVar8 = *(int *)(interpolate(int,int,basisu::color_rgba_const&,basisu::color_rgba_const&,basisu::color_rgba_const&,basisu::color_rgba_const&)
                             ::s_interp + (ulong)(x & 3) * 4);
            iVar2 = *(int *)(interpolate(int,int,basisu::color_rgba_const&,basisu::color_rgba_const&,basisu::color_rgba_const&,basisu::color_rgba_const&)
                             ::s_interp + (ulong)((uint)local_48 & 3) * 4);
            do {
              iVar4 = ((uint)local_54.m_comps[lVar10] - (uint)local_50.m_comps[lVar10]) * iVar8 +
                      (uint)local_50.m_comps[lVar10] * 4;
              iVar4 = (((uint)local_58.m_comps[lVar10] * 4 - iVar4) +
                      ((uint)local_5c.m_comps[lVar10] - (uint)local_58.m_comps[lVar10]) * iVar8) *
                      iVar2 + iVar4 * 4;
              if (lVar10 == 3) {
                iVar7 = iVar4 >> 4;
              }
              else {
                iVar7 = iVar4 >> 1;
                iVar4 = iVar4 >> 6;
              }
              local_40 = uVar12;
              if (0xff < (uint)(iVar4 + iVar7)) goto LAB_0024a42e;
              local_4c.m_comps[lVar10] = (uint8_t)(iVar4 + iVar7);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            *local_38 = local_4c;
            uVar6 = (this->m_blocks).m_width;
            if ((uVar6 <= uVar5) || ((this->m_blocks).m_height <= uVar13)) goto LAB_0024a44d;
            uVar6 = uVar6 * uVar13 + uVar5;
            if (uVar6 < (this->m_blocks).m_values.m_size) {
              local_50.field_1 =
                   (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                   pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,1);
              uVar6 = (this->m_blocks).m_width;
              if ((uVar6 <= uVar9) || ((this->m_blocks).m_height <= uVar13)) goto LAB_0024a44d;
              uVar6 = uVar6 * uVar13 + uVar9;
              if (uVar6 < (this->m_blocks).m_values.m_size) {
                local_54.field_1 =
                     (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                     pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar6,1);
                uVar6 = (this->m_blocks).m_width;
                if ((uVar6 <= uVar5) || ((this->m_blocks).m_height <= uVar11)) goto LAB_0024a44d;
                uVar5 = uVar6 * uVar11 + uVar5;
                if (uVar5 < (this->m_blocks).m_values.m_size) {
                  local_58.field_1 =
                       (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                       pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar5,1);
                  uVar6 = (this->m_blocks).m_width;
                  if ((uVar6 <= uVar9) || ((this->m_blocks).m_height <= uVar11)) goto LAB_0024a44d;
                  uVar9 = uVar6 * uVar11 + uVar9;
                  if (uVar9 < (this->m_blocks).m_values.m_size) {
                    local_5c.field_1 =
                         (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1)
                         pvrtc4_block::get_endpoint_5554((this->m_blocks).m_values.m_p + uVar9,1);
                    lVar10 = 0;
                    do {
                      iVar4 = ((uint)local_54.m_comps[lVar10] - (uint)local_50.m_comps[lVar10]) *
                              iVar8 + (uint)local_50.m_comps[lVar10] * 4;
                      iVar4 = (((uint)local_58.m_comps[lVar10] * 4 - iVar4) +
                              ((uint)local_5c.m_comps[lVar10] - (uint)local_58.m_comps[lVar10]) *
                              iVar8) * iVar2 + iVar4 * 4;
                      if (lVar10 == 3) {
                        iVar7 = iVar4 >> 4;
                      }
                      else {
                        iVar7 = iVar4 >> 1;
                        iVar4 = iVar4 >> 6;
                      }
                      if (0xff < (uint)(iVar4 + iVar7)) {
LAB_0024a42e:
                        __assert_fail("(v >= 0) && (v < 256)",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_pvrtc1_4.h"
                                      ,0x165,
                                      "color_rgba basisu::pvrtc4_image::interpolate(int, int, const color_rgba &, const color_rgba &, const color_rgba &, const color_rgba &) const"
                                     );
                      }
                      local_4c.m_comps[lVar10] = (uint8_t)(iVar4 + iVar7);
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 4);
                    paVar3[3] = local_4c;
                    uVar11 = (uint)(local_40 >> 2) & 0x3fffffff;
                    uVar9 = (this->m_blocks).m_width;
                    if ((uVar9 <= uVar11) ||
                       (uVar6 = (uint)(local_48 >> 2) & 0x3fffffff,
                       (this->m_blocks).m_height <= uVar6)) goto LAB_0024a44d;
                    uVar11 = uVar9 * uVar6 + uVar11;
                    if (uVar11 < (this->m_blocks).m_values.m_size) {
                      uVar9 = (this->m_blocks).m_values.m_p[uVar11].m_endpoints;
                      auVar18 = pmovzxbw(ZEXT416((uint)*(
                                                  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1
                                                  *)paVar3),
                                         ZEXT416((uint)*(
                                                  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1
                                                  *)paVar3));
                      sVar15 = auVar18._0_2_;
                      sVar22 = auVar18._2_2_;
                      sVar23 = auVar18._4_2_;
                      sVar24 = auVar18._6_2_;
                      sVar25 = auVar18._8_2_;
                      sVar26 = auVar18._10_2_;
                      sVar27 = auVar18._12_2_;
                      sVar28 = auVar18._14_2_;
                      if ((uVar9 & 1) == 0) {
                        auVar18 = psllw(auVar18,2);
                        auVar19 = pmovzxbw(ZEXT416((uint)paVar3[3]),ZEXT416((uint)paVar3[3]));
                        auVar29._0_2_ = (ushort)(auVar19._0_2_ * 3 + auVar18._0_2_ + sVar15) >> 3;
                        auVar29._2_2_ = (ushort)(auVar19._2_2_ * 3 + auVar18._2_2_ + sVar22) >> 3;
                        auVar29._4_2_ = (ushort)(auVar19._4_2_ * 3 + auVar18._4_2_ + sVar23) >> 3;
                        auVar29._6_2_ = (ushort)(auVar19._6_2_ * 3 + auVar18._6_2_ + sVar24) >> 3;
                        auVar29._8_2_ = (ushort)(auVar19._8_2_ * 3 + auVar18._8_2_ + sVar25) >> 3;
                        auVar29._10_2_ = (ushort)(auVar19._10_2_ * 3 + auVar18._10_2_ + sVar26) >> 3
                        ;
                        auVar29._12_2_ = (ushort)(auVar19._12_2_ * 3 + auVar18._12_2_ + sVar27) >> 3
                        ;
                        auVar29._14_2_ = (ushort)(auVar19._14_2_ * 3 + auVar18._14_2_ + sVar28) >> 3
                        ;
                        auVar18 = pshufb(auVar29,ZEXT416(0x6040200));
                        paVar3[1] = auVar18._0_4_;
                        auVar18 = psllw(auVar19,2);
                        auVar21._0_2_ = (ushort)(auVar18._0_2_ + auVar19._0_2_ + sVar15 * 3) >> 3;
                        auVar21._2_2_ = (ushort)(auVar18._2_2_ + auVar19._2_2_ + sVar22 * 3) >> 3;
                        auVar21._4_2_ = (ushort)(auVar18._4_2_ + auVar19._4_2_ + sVar23 * 3) >> 3;
                        auVar21._6_2_ = (ushort)(auVar18._6_2_ + auVar19._6_2_ + sVar24 * 3) >> 3;
                        auVar21._8_2_ = (ushort)(auVar18._8_2_ + auVar19._8_2_ + sVar25 * 3) >> 3;
                        auVar21._10_2_ = (ushort)(auVar18._10_2_ + auVar19._10_2_ + sVar26 * 3) >> 3
                        ;
                        auVar21._12_2_ = (ushort)(auVar18._12_2_ + auVar19._12_2_ + sVar27 * 3) >> 3
                        ;
                        auVar21._14_2_ = (ushort)(auVar18._14_2_ + auVar19._14_2_ + sVar28 * 3) >> 3
                        ;
                        auVar18 = pshufb(auVar21,ZEXT416(0x6040200));
                        paVar3[2] = auVar18._0_4_;
                      }
                      else {
                        auVar17[1] = (0 < sVar22) * (sVar22 < 0x100) * auVar18[2] - (0xff < sVar22);
                        auVar17[0] = (0 < sVar15) * (sVar15 < 0x100) * auVar18[0] - (0xff < sVar15);
                        auVar17[2] = (0 < sVar23) * (sVar23 < 0x100) * auVar18[4] - (0xff < sVar23);
                        auVar17[3] = (0 < sVar24) * (sVar24 < 0x100) * auVar18[6] - (0xff < sVar24);
                        auVar17._4_3_ = 0;
                        auVar17[7] = (0 < sVar28) * (sVar28 < 0x100) * auVar18[0xe] -
                                     (0xff < sVar28);
                        auVar17[8] = (0 < sVar15) * (sVar15 < 0x100) * auVar18[0] - (0xff < sVar15);
                        auVar17[9] = (0 < sVar22) * (sVar22 < 0x100) * auVar18[2] - (0xff < sVar22);
                        auVar17[10] = (0 < sVar23) * (sVar23 < 0x100) * auVar18[4] - (0xff < sVar23)
                        ;
                        auVar17[0xb] = (0 < sVar24) * (sVar24 < 0x100) * auVar18[6] -
                                       (0xff < sVar24);
                        auVar17[0xc] = (0 < sVar25) * (sVar25 < 0x100) * auVar18[8] -
                                       (0xff < sVar25);
                        auVar17[0xd] = (0 < sVar26) * (sVar26 < 0x100) * auVar18[10] -
                                       (0xff < sVar26);
                        auVar17[0xe] = (0 < sVar27) * (sVar27 < 0x100) * auVar18[0xc] -
                                       (0xff < sVar27);
                        auVar19[0xf] = (0 < sVar28) * (sVar28 < 0x100) * auVar18[0xe] -
                                       (0xff < sVar28);
                        auVar19._0_15_ = auVar17;
                        auVar18[0xf] = 0;
                        auVar18._0_15_ = auVar17;
                        auVar18 = ZEXT416((uint)paVar3[3]) & auVar18;
                        auVar19 = auVar19 ^ ZEXT416((uint)paVar3[3]);
                        auVar20._0_2_ = auVar19._0_2_ >> 1;
                        auVar20._2_2_ = auVar19._2_2_ >> 1;
                        auVar20._4_4_ = 0;
                        auVar20._8_2_ = auVar19._8_2_ >> 1;
                        auVar20._10_2_ = auVar19._10_2_ >> 1;
                        auVar20._12_2_ = auVar19._12_2_ >> 1;
                        auVar20._14_2_ = auVar19._14_2_ >> 1;
                        auVar20 = auVar20 & _DAT_00277880;
                        aVar16._0_1_ = auVar20[0] + auVar18[0];
                        aVar16._1_1_ = auVar20[1] + auVar18[1];
                        aVar16._2_1_ = auVar20[2] + auVar18[2];
                        aVar16._3_1_ = auVar20[3] + auVar18[3];
                        paVar3[1] = aVar16;
                        paVar3[2] = aVar16;
                        *(undefined1 *)((long)paVar3 + 0xb) = 0;
                      }
                      return (bool)((byte)uVar9 & 1);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __assert_fail("i < m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x177,
                  "const T &basisu::vector<basisu::pvrtc4_block>::operator[](size_t) const [T = basisu::pvrtc4_block]"
                 );
  }
LAB_0024a44d:
  __assert_fail("x < m_width && y < m_height",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                ,0xd29,
                "const T &basisu::vector2D<basisu::pvrtc4_block>::operator()(uint32_t, uint32_t) const [T = basisu::pvrtc4_block]"
               );
}

Assistant:

bool pvrtc4_image::get_interpolated_colors(uint32_t x, uint32_t y, color_rgba* pColors) const
	{
		assert((x < m_width) && (y < m_height));

		int block_x0 = (static_cast<int>(x) - 2) >> 2;
		int block_x1 = block_x0 + 1;
		int block_y0 = (static_cast<int>(y) - 2) >> 2;
		int block_y1 = block_y0 + 1;
		
		block_x0 = posmod(block_x0, m_block_width);
		block_x1 = posmod(block_x1, m_block_width);
		block_y0 = posmod(block_y0, m_block_height);
		block_y1 = posmod(block_y1, m_block_height);
		
		pColors[0] = interpolate(x, y, m_blocks(block_x0, block_y0).get_endpoint_5554(0), m_blocks(block_x1, block_y0).get_endpoint_5554(0), m_blocks(block_x0, block_y1).get_endpoint_5554(0), m_blocks(block_x1, block_y1).get_endpoint_5554(0));
		pColors[3] = interpolate(x, y, m_blocks(block_x0, block_y0).get_endpoint_5554(1), m_blocks(block_x1, block_y0).get_endpoint_5554(1), m_blocks(block_x0, block_y1).get_endpoint_5554(1), m_blocks(block_x1, block_y1).get_endpoint_5554(1));

		if (get_block_uses_transparent_modulation(x >> 2, y >> 2))
		{
			for (uint32_t c = 0; c < 4; c++)
			{
				uint32_t m = (pColors[0][c] + pColors[3][c]) / 2;
				pColors[1][c] = static_cast<uint8_t>(m);
				pColors[2][c] = static_cast<uint8_t>(m);
			}
			pColors[2][3] = 0;
			return true;
		}

		for (uint32_t c = 0; c < 4; c++)
		{
			pColors[1][c] = static_cast<uint8_t>((pColors[0][c] * 5 + pColors[3][c] * 3) / 8);
			pColors[2][c] = static_cast<uint8_t>((pColors[0][c] * 3 + pColors[3][c] * 5) / 8);
		}

		return false;
	}